

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_block.cpp
# Opt level: O3

int duckdb::SBIterator::ComparisonValue(ExpressionType comparison)

{
  InternalException *this;
  string local_40;
  
  if ((byte)(comparison - COMPARE_LESSTHAN) < 4) {
    return *(int *)(&DAT_01dd95c0 + (ulong)(byte)(comparison - COMPARE_LESSTHAN) * 4);
  }
  this = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unimplemented comparison type for IEJoin!","");
  InternalException::InternalException(this,&local_40);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

int SBIterator::ComparisonValue(ExpressionType comparison) {
	switch (comparison) {
	case ExpressionType::COMPARE_LESSTHAN:
	case ExpressionType::COMPARE_GREATERTHAN:
		return -1;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		return 0;
	default:
		throw InternalException("Unimplemented comparison type for IEJoin!");
	}
}